

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

shared_ptr<GenApi_3_4::CNodeMapRef> __thiscall rcg::Stream::getNodeMap(Stream *this)

{
  CPort *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<GenApi_3_4::CNodeMapRef> sVar1;
  __shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2> *local_58;
  __shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::recursive_mutex::lock((recursive_mutex *)&((pthread_mutex_t *)(in_RSI + 0xa0))->__data);
  if ((*(long *)(in_RSI + 0xd0) != 0) && (*(long *)(in_RSI + 0xf8) == 0)) {
    this_00 = (CPort *)operator_new(0x20);
    local_58 = (__shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x70);
    std::__shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,local_58);
    CPort::CPort(this_00,(shared_ptr<const_rcg::GenTLWrapper> *)&local_40,(void **)(in_RSI + 0xd0));
    std::__shared_ptr<rcg::CPort,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::CPort,void>
              ((__shared_ptr<rcg::CPort,(__gnu_cxx::_Lock_policy)2> *)&local_68,this_00);
    std::__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0xe8),&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,local_58);
    allocNodeMap((rcg *)&local_68,(shared_ptr<const_rcg::GenTLWrapper> *)&local_50,
                 *(void **)(in_RSI + 0xd0),*(CPort **)(in_RSI + 0xe8),(char *)0x0);
    std::__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0xf8),
               (__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  std::__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0xf8));
  pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0xa0));
  sVar1.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<GenApi_3_4::CNodeMapRef>)
         sVar1.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenApi::CNodeMapRef> Stream::getNodeMap()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  if (stream != 0 && !nodemap)
  {
    cport=std::shared_ptr<CPort>(new CPort(gentl, &stream));
    nodemap=allocNodeMap(gentl, stream, cport.get());
  }

  return nodemap;
}